

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CustomLayerParams_CustomLayerParamValue::Clear
          (CustomLayerParams_CustomLayerParamValue *this)

{
  uint32_t cached_has_bits;
  CustomLayerParams_CustomLayerParamValue *this_local;
  
  clear_value(this);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void CustomLayerParams_CustomLayerParamValue::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.CustomLayerParams.CustomLayerParamValue)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  clear_value();
  _internal_metadata_.Clear<std::string>();
}